

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcount.c++
# Opt level: O3

bool __thiscall kj::AtomicRefcounted::addRefWeakInternal(AtomicRefcounted *this)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  uVar2 = this->refcount;
  do {
    uVar1 = uVar2;
    if (uVar1 == 0) break;
    LOCK();
    uVar2 = this->refcount;
    bVar3 = uVar1 == uVar2;
    if (bVar3) {
      this->refcount = uVar1 + 1;
      uVar2 = uVar1;
    }
    UNLOCK();
  } while (!bVar3);
  return uVar1 != 0;
}

Assistant:

bool AtomicRefcounted::addRefWeakInternal() const {
#if _MSC_VER
  long orig = refcount;

  for (;;) {
    if (orig == 0) {
      // Refcount already hit zero. Destructor is already running so we can't revive the object.
      return false;
    }

    unsigned long old = KJ_MSVC_INTERLOCKED(CompareExchange, nf)(&refcount, orig + 1, orig);
    if (old == orig) {
      return true;
    }
    orig = old;
  }
#else
  uint orig = __atomic_load_n(&refcount, __ATOMIC_RELAXED);

  for (;;) {
    if (orig == 0) {
      // Refcount already hit zero. Destructor is already running so we can't revive the object.
      return false;
    }

    if (__atomic_compare_exchange_n(&refcount, &orig, orig + 1, true,
        __ATOMIC_RELAXED, __ATOMIC_RELAXED)) {
      // Successfully incremented refcount without letting it hit zero.
      return true;
    }
  }
#endif
}